

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O1

void __thiscall
DReachabilityPropagator::explain_dominator(DReachabilityPropagator *this,int u,int dom,vec<Lit> *ps)

{
  uint uVar1;
  BoolView *pBVar2;
  int skip_n;
  vector<bool,_std::allocator<bool>_> red;
  vector<bool,_std::allocator<bool>_> v;
  allocator_type local_86;
  allocator_type local_85;
  int local_84;
  vector<bool,_std::allocator<bool>_> local_80;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_84 = dom;
  vec<Lit>::push(ps);
  uVar1 = (this->super_GraphPropagator).vs.data[(uint)this->root].v;
  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,
                (uint)((int)sat.assigns.data[uVar1] - 1U < 0xfffffffd) + uVar1 * 2);
  vec<Lit>::push(ps,(Lit *)&local_80);
  pBVar2 = (this->super_GraphPropagator).vs.data;
  if ((sat.assigns.data[(uint)pBVar2[(uint)u].v] != '\0') &&
     ((uint)pBVar2[(uint)u].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar2[(uint)u].v])) {
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                  (uint)((int)sat.assigns.data[(uint)pBVar2[(uint)u].v] - 1U < 0xfffffffd) +
                  pBVar2[(uint)u].v * 2);
    vec<Lit>::push(ps,(Lit *)&local_80);
  }
  local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_58,&local_86);
  skip_n = local_84;
  reverseDFS(this,u,&local_80,local_84);
  local_86 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_86,&local_85);
  reverseDFStoBorder(this,u,&local_58,&local_80,ps,skip_n);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void DReachabilityPropagator::explain_dominator(int u, int dom, vec<Lit>& ps) {
	if (DEBUG) {
		std::cout << "Explain dominators " << getNodeVar(get_root_idx()).isFixed()
							<< getNodeVar(u).isFixed() << '\n';
	}
	ps.push();
	ps.push(getNodeVar(get_root_idx()).getValLit());
	if (getNodeVar(u).isFixed() && getNodeVar(u).isTrue()) {
		ps.push(getNodeVar(u).getValLit());
	}
	std::vector<bool> red(nbNodes(), false);
	reverseDFS(u, red, dom);
	std::vector<bool> v(nbNodes(), false);
	reverseDFStoBorder(u, v, red, ps, dom);
	if (DEBUG) {
		std::cout << "Size expl for dominator " << ps.size() << '\n';
	}
}